

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O1

timestamp_t
duckdb::TimeBucket::OffsetWidthConvertibleToMonthsTernaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
          (interval_t bucket_width,timestamp_t ts,interval_t offset)

{
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  date_t input;
  timestamp_t ts_00;
  int right;
  int64_t extraout_RDX;
  int right_00;
  undefined1 auVar5 [12];
  interval_t iVar6;
  undefined1 auVar7 [16];
  timestamp_t result;
  timestamp_t local_50;
  string local_48;
  
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(ts);
  if (bVar1) {
    iVar6.micros = extraout_RDX;
    iVar6.months = (int)offset.micros;
    iVar6.days = (int)((ulong)offset.micros >> 0x20);
    iVar6 = Interval::Invert(offset._0_8_,iVar6);
    ts_00 = Interval::Add(ts,iVar6);
    iVar2 = EpochMonths<duckdb::timestamp_t>(ts_00);
    right_00 = bucket_width.months;
    right = (int)(0x168 % (long)right_00);
    iVar3 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar2,right);
    iVar4 = iVar3 - iVar3 % right_00;
    if (iVar3 % right_00 != 0 && iVar3 < 0) {
      iVar4 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar4,right_00);
    }
    iVar4 = iVar4 + right;
    iVar3 = iVar4 % 0xc;
    iVar2 = iVar3 + 1;
    if (iVar3 != 0 && -1 >= iVar4) {
      iVar2 = iVar3 + 0xd;
    }
    input = Date::FromDate((iVar3 == 0 || -1 < iVar4) + 0x7b1 + iVar4 / 0xc,iVar2,1);
    bVar1 = TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(input,&local_50,false);
    if (!bVar1) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_48,(duckdb *)(ulong)(uint)input.days,(date_t)auVar5._8_4_);
      InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_48);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    local_50 = Interval::Add(local_50,offset);
  }
  else {
    bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(ts,&local_50,false);
    if (!bVar1) {
      auVar7 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_48,(duckdb *)ts.value,(timestamp_t)auVar7._8_8_);
      InvalidInputException::InvalidInputException(auVar7._0_8_,(string *)&local_48);
      __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  return (timestamp_t)local_50.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC offset) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(Interval::Add(ts, Interval::Invert(offset)));
			return Interval::Add(Cast::template Operation<date_t, TR>(WidthConvertibleToMonthsCommon(
			                         bucket_width.months, ts_months, DEFAULT_ORIGIN_MONTHS)),
			                     offset);
		}